

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

size_t wwLoZeroBits(word *a,size_t n)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0;
  if (n == 0) {
LAB_0014a4c5:
    if (sVar2 != n) {
      sVar1 = u64CTZ(a[sVar2]);
      return sVar1 + sVar2 * 0x40;
    }
  }
  else {
    do {
      if (a[sVar2] != 0) goto LAB_0014a4c5;
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
  }
  return n << 6;
}

Assistant:

size_t wwLoZeroBits(const word a[], size_t n)
{
	register size_t i;
	ASSERT(wwIsValid(a, n));
	// поиск младшего ненулевого машинного слова
	for (i = 0; i < n && a[i] == 0; ++i);
	// нулевое слово?
	if (i == n)
		return n * B_PER_W;
	// ...ненулевое
	return i * B_PER_W + wordCTZ(a[i]);
}